

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperEQ<char[437],std::__cxx11::string>
          (internal *this,char *lhs_expression,char *rhs_expression,char (*lhs) [437],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  int iVar1;
  AssertionResult AVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  iVar1 = std::__cxx11::string::compare((char *)rhs);
  if (iVar1 == 0) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    AVar3 = CmpHelperEQFailure<char[437],std::__cxx11::string>
                      (this,lhs_expression,rhs_expression,lhs,rhs);
    sVar2 = AVar3.message_.ptr_;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
GTEST_DISABLE_MSC_WARNINGS_PUSH_(4389 /* signed/unsigned mismatch */)
  if (lhs == rhs) {
    return AssertionSuccess();
  }
GTEST_DISABLE_MSC_WARNINGS_POP_()

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}